

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  BaseNode_conflict *node;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  uint uVar63;
  ulong *puVar64;
  ulong uVar65;
  RTCIntersectArguments *pRVar66;
  ulong *puVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar82;
  float fVar86;
  undefined1 auVar81 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar94;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar95;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar96;
  float fVar101;
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [32];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar115;
  float fVar118;
  float fVar120;
  undefined1 auVar110 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar121;
  undefined1 auVar114 [32];
  float fVar125;
  float fVar133;
  float fVar134;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar139;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar141 [32];
  float fVar147;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar157;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar175;
  float fVar181;
  float fVar182;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar183;
  float fVar187;
  undefined1 auVar180 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar190;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [64];
  float fVar199;
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar210;
  undefined1 auVar211 [32];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar212 [64];
  float fVar219;
  float fVar220;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar221 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_177c;
  ulong *local_1778;
  long local_1770;
  long local_1768;
  undefined8 local_1760;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  uint local_1728;
  uint local_1724;
  uint local_1720;
  RTCFilterFunctionNArguments local_1710;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar108 = ray->tfar;
    if (0.0 <= fVar108) {
      puVar67 = local_11f8;
      aVar4 = (ray->dir).field_0;
      auVar74 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75 = vandps_avx((undefined1  [16])aVar4,auVar75);
      auVar126._8_4_ = 0x219392ef;
      auVar126._0_8_ = 0x219392ef219392ef;
      auVar126._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar75,auVar126,1);
      auVar75 = vblendvps_avx((undefined1  [16])aVar4,auVar126,auVar75);
      auVar126 = vrcpps_avx(auVar75);
      fVar107 = auVar126._0_4_;
      auVar97._0_4_ = fVar107 * auVar75._0_4_;
      fVar115 = auVar126._4_4_;
      auVar97._4_4_ = fVar115 * auVar75._4_4_;
      fVar118 = auVar126._8_4_;
      auVar97._8_4_ = fVar118 * auVar75._8_4_;
      fVar120 = auVar126._12_4_;
      auVar97._12_4_ = fVar120 * auVar75._12_4_;
      auVar127._8_4_ = 0x3f800000;
      auVar127._0_8_ = 0x3f8000003f800000;
      auVar127._12_4_ = 0x3f800000;
      auVar75 = vsubps_avx(auVar127,auVar97);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      auVar192 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar201 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar209 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      auVar98._0_4_ = fVar107 + fVar107 * auVar75._0_4_;
      auVar98._4_4_ = fVar115 + fVar115 * auVar75._4_4_;
      auVar98._8_4_ = fVar118 + fVar118 * auVar75._8_4_;
      auVar98._12_4_ = fVar120 + fVar120 * auVar75._12_4_;
      auVar75 = vshufps_avx(auVar98,auVar98,0);
      auVar212 = ZEXT3264(CONCAT1616(auVar75,auVar75));
      auVar75 = vmovshdup_avx(auVar98);
      auVar126 = vshufps_avx(auVar98,auVar98,0x55);
      auVar221 = ZEXT3264(CONCAT1616(auVar126,auVar126));
      auVar126 = vshufpd_avx(auVar98,auVar98,1);
      auVar97 = vshufps_avx(auVar98,auVar98,0xaa);
      uVar68 = (ulong)(auVar98._0_4_ < 0.0) << 3;
      local_1420._16_16_ = auVar97;
      local_1420._0_16_ = auVar97;
      uVar59 = (ulong)(auVar75._0_4_ < 0.0);
      lVar1 = uVar59 * 8;
      uVar60 = (ulong)(auVar126._0_4_ < 0.0);
      lVar2 = uVar60 * 8;
      auVar75 = vshufps_avx(auVar74,auVar74,0);
      local_1440._16_16_ = auVar75;
      local_1440._0_16_ = auVar75;
      auVar75 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
      local_1460._16_16_ = auVar75;
      local_1460._0_16_ = auVar75;
      uVar70 = uVar68 ^ 8;
      uVar72 = lVar1 + 0x10U ^ 8;
      uVar71 = lVar2 + 0x20U ^ 8;
      local_1480._0_16_ = mm_lookupmask_ps._0_16_;
      local_1480._16_16_ = mm_lookupmask_ps._240_16_;
      do {
        uVar69 = puVar67[-1];
        puVar67 = puVar67 + -1;
        while( true ) {
          local_15c0 = auVar192._0_32_;
          local_15e0 = auVar201._0_32_;
          local_1600 = auVar209._0_32_;
          if ((uVar69 & 8) != 0) break;
          uVar61 = uVar69 & 0xfffffffffffffff0;
          puVar64 = (ulong *)(uVar61 + 0x40);
          if (uVar61 == 0) {
            puVar64 = (ulong *)0x0;
          }
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *puVar64;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = puVar64[1];
          auVar75 = vpminub_avx(auVar74,auVar87);
          auVar75 = vpcmpeqb_avx(auVar74,auVar75);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = *(ulong *)((long)puVar64 + 4);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)((long)puVar64 + 0xc);
          auVar74 = vpminub_avx(auVar77,auVar99);
          fVar108 = *(float *)(puVar64 + 6);
          auVar74 = vpcmpeqb_avx(auVar77,auVar74);
          fVar107 = *(float *)((long)puVar64 + 0x3c);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)((long)puVar64 + uVar68);
          auVar126 = vpmovzxbd_avx(auVar88);
          auVar128._8_8_ = 0;
          auVar128._0_8_ = *(ulong *)((long)puVar64 + uVar68 + 4);
          auVar97 = vpmovzxbd_avx(auVar128);
          auVar89._16_16_ = auVar97;
          auVar89._0_16_ = auVar126;
          auVar18 = vcvtdq2ps_avx(auVar89);
          auVar90._0_4_ = fVar108 + fVar107 * auVar18._0_4_;
          auVar90._4_4_ = fVar108 + fVar107 * auVar18._4_4_;
          auVar90._8_4_ = fVar108 + fVar107 * auVar18._8_4_;
          auVar90._12_4_ = fVar108 + fVar107 * auVar18._12_4_;
          auVar90._16_4_ = fVar108 + fVar107 * auVar18._16_4_;
          auVar90._20_4_ = fVar108 + fVar107 * auVar18._20_4_;
          auVar90._24_4_ = fVar108 + fVar107 * auVar18._24_4_;
          auVar90._28_4_ = fVar108 + auVar18._28_4_;
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)((long)puVar64 + uVar70);
          auVar126 = vpmovzxbd_avx(auVar129);
          auVar140._8_8_ = 0;
          auVar140._0_8_ = *(ulong *)((long)puVar64 + uVar70 + 4);
          auVar97 = vpmovzxbd_avx(auVar140);
          auVar130._16_16_ = auVar97;
          auVar130._0_16_ = auVar126;
          auVar18 = vcvtdq2ps_avx(auVar130);
          fVar115 = *(float *)((long)puVar64 + 0x34);
          auVar100._0_4_ = fVar108 + fVar107 * auVar18._0_4_;
          auVar100._4_4_ = fVar108 + fVar107 * auVar18._4_4_;
          auVar100._8_4_ = fVar108 + fVar107 * auVar18._8_4_;
          auVar100._12_4_ = fVar108 + fVar107 * auVar18._12_4_;
          auVar100._16_4_ = fVar108 + fVar107 * auVar18._16_4_;
          auVar100._20_4_ = fVar108 + fVar107 * auVar18._20_4_;
          auVar100._24_4_ = fVar108 + fVar107 * auVar18._24_4_;
          auVar100._28_4_ = fVar108 + fVar107;
          fVar108 = *(float *)(puVar64 + 8);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = puVar64[uVar59 + 2];
          auVar126 = vpmovzxbd_avx(auVar110);
          auVar151._8_8_ = 0;
          auVar151._0_8_ = *(ulong *)((long)puVar64 + lVar1 + 0x14);
          auVar97 = vpmovzxbd_avx(auVar151);
          auVar111._16_16_ = auVar97;
          auVar111._0_16_ = auVar126;
          auVar18 = vcvtdq2ps_avx(auVar111);
          auVar112._0_4_ = fVar115 + fVar108 * auVar18._0_4_;
          auVar112._4_4_ = fVar115 + fVar108 * auVar18._4_4_;
          auVar112._8_4_ = fVar115 + fVar108 * auVar18._8_4_;
          auVar112._12_4_ = fVar115 + fVar108 * auVar18._12_4_;
          auVar112._16_4_ = fVar115 + fVar108 * auVar18._16_4_;
          auVar112._20_4_ = fVar115 + fVar108 * auVar18._20_4_;
          auVar112._24_4_ = fVar115 + fVar108 * auVar18._24_4_;
          auVar112._28_4_ = fVar115 + auVar18._28_4_;
          auVar152._8_8_ = 0;
          auVar152._0_8_ = *(ulong *)((long)puVar64 + uVar72);
          auVar126 = vpmovzxbd_avx(auVar152);
          auVar158._8_8_ = 0;
          auVar158._0_8_ = *(ulong *)((long)puVar64 + uVar72 + 4);
          auVar97 = vpmovzxbd_avx(auVar158);
          auVar153._16_16_ = auVar97;
          auVar153._0_16_ = auVar126;
          auVar18 = vcvtdq2ps_avx(auVar153);
          fVar107 = *(float *)(puVar64 + 7);
          auVar131._0_4_ = fVar115 + fVar108 * auVar18._0_4_;
          auVar131._4_4_ = fVar115 + fVar108 * auVar18._4_4_;
          auVar131._8_4_ = fVar115 + fVar108 * auVar18._8_4_;
          auVar131._12_4_ = fVar115 + fVar108 * auVar18._12_4_;
          auVar131._16_4_ = fVar115 + fVar108 * auVar18._16_4_;
          auVar131._20_4_ = fVar115 + fVar108 * auVar18._20_4_;
          auVar131._24_4_ = fVar115 + fVar108 * auVar18._24_4_;
          auVar131._28_4_ = fVar115 + fVar108;
          fVar108 = *(float *)((long)puVar64 + 0x44);
          auVar159._8_8_ = 0;
          auVar159._0_8_ = puVar64[uVar60 + 4];
          auVar126 = vpmovzxbd_avx(auVar159);
          auVar176._8_8_ = 0;
          auVar176._0_8_ = *(ulong *)((long)puVar64 + lVar2 + 0x24);
          auVar97 = vpmovzxbd_avx(auVar176);
          auVar160._16_16_ = auVar97;
          auVar160._0_16_ = auVar126;
          auVar177._8_8_ = 0;
          auVar177._0_8_ = *(ulong *)((long)puVar64 + uVar71);
          auVar126 = vpmovzxbd_avx(auVar177);
          auVar188._8_8_ = 0;
          auVar188._0_8_ = *(ulong *)((long)puVar64 + uVar71 + 4);
          auVar97 = vpmovzxbd_avx(auVar188);
          auVar178._16_16_ = auVar97;
          auVar178._0_16_ = auVar126;
          auVar18 = vcvtdq2ps_avx(auVar160);
          auVar19 = vcvtdq2ps_avx(auVar178);
          auVar161._0_4_ = auVar18._0_4_ * fVar108 + fVar107;
          auVar161._4_4_ = auVar18._4_4_ * fVar108 + fVar107;
          auVar161._8_4_ = auVar18._8_4_ * fVar108 + fVar107;
          auVar161._12_4_ = auVar18._12_4_ * fVar108 + fVar107;
          auVar161._16_4_ = auVar18._16_4_ * fVar108 + fVar107;
          auVar161._20_4_ = auVar18._20_4_ * fVar108 + fVar107;
          auVar161._24_4_ = auVar18._24_4_ * fVar108 + fVar107;
          auVar161._28_4_ = auVar18._28_4_ + fVar107;
          auVar141._0_4_ = fVar107 + auVar19._0_4_ * fVar108;
          auVar141._4_4_ = fVar107 + auVar19._4_4_ * fVar108;
          auVar141._8_4_ = fVar107 + auVar19._8_4_ * fVar108;
          auVar141._12_4_ = fVar107 + auVar19._12_4_ * fVar108;
          auVar141._16_4_ = fVar107 + auVar19._16_4_ * fVar108;
          auVar141._20_4_ = fVar107 + auVar19._20_4_ * fVar108;
          auVar141._24_4_ = fVar107 + auVar19._24_4_ * fVar108;
          auVar141._28_4_ = fVar107 + fVar108;
          auVar18 = vsubps_avx(auVar90,local_15c0);
          auVar26._4_4_ = auVar212._4_4_ * auVar18._4_4_;
          auVar26._0_4_ = auVar212._0_4_ * auVar18._0_4_;
          auVar26._8_4_ = auVar212._8_4_ * auVar18._8_4_;
          auVar26._12_4_ = auVar212._12_4_ * auVar18._12_4_;
          auVar26._16_4_ = auVar212._16_4_ * auVar18._16_4_;
          auVar26._20_4_ = auVar212._20_4_ * auVar18._20_4_;
          auVar26._24_4_ = auVar212._24_4_ * auVar18._24_4_;
          auVar26._28_4_ = auVar18._28_4_;
          auVar18 = vsubps_avx(auVar112,local_15e0);
          auVar27._4_4_ = auVar221._4_4_ * auVar18._4_4_;
          auVar27._0_4_ = auVar221._0_4_ * auVar18._0_4_;
          auVar27._8_4_ = auVar221._8_4_ * auVar18._8_4_;
          auVar27._12_4_ = auVar221._12_4_ * auVar18._12_4_;
          auVar27._16_4_ = auVar221._16_4_ * auVar18._16_4_;
          auVar27._20_4_ = auVar221._20_4_ * auVar18._20_4_;
          auVar27._24_4_ = auVar221._24_4_ * auVar18._24_4_;
          auVar27._28_4_ = auVar18._28_4_;
          auVar18 = vmaxps_avx(auVar26,auVar27);
          auVar19 = vsubps_avx(auVar161,local_1600);
          auVar28._4_4_ = local_1420._4_4_ * auVar19._4_4_;
          auVar28._0_4_ = local_1420._0_4_ * auVar19._0_4_;
          auVar28._8_4_ = local_1420._8_4_ * auVar19._8_4_;
          auVar28._12_4_ = local_1420._12_4_ * auVar19._12_4_;
          auVar28._16_4_ = local_1420._16_4_ * auVar19._16_4_;
          auVar28._20_4_ = local_1420._20_4_ * auVar19._20_4_;
          auVar28._24_4_ = local_1420._24_4_ * auVar19._24_4_;
          auVar28._28_4_ = auVar19._28_4_;
          auVar19 = vmaxps_avx(auVar28,local_1440);
          auVar18 = vmaxps_avx(auVar18,auVar19);
          auVar19 = vsubps_avx(auVar100,local_15c0);
          auVar29._4_4_ = auVar212._4_4_ * auVar19._4_4_;
          auVar29._0_4_ = auVar212._0_4_ * auVar19._0_4_;
          auVar29._8_4_ = auVar212._8_4_ * auVar19._8_4_;
          auVar29._12_4_ = auVar212._12_4_ * auVar19._12_4_;
          auVar29._16_4_ = auVar212._16_4_ * auVar19._16_4_;
          auVar29._20_4_ = auVar212._20_4_ * auVar19._20_4_;
          auVar29._24_4_ = auVar212._24_4_ * auVar19._24_4_;
          auVar29._28_4_ = auVar19._28_4_;
          auVar19 = vsubps_avx(auVar131,local_15e0);
          auVar30._4_4_ = auVar221._4_4_ * auVar19._4_4_;
          auVar30._0_4_ = auVar221._0_4_ * auVar19._0_4_;
          auVar30._8_4_ = auVar221._8_4_ * auVar19._8_4_;
          auVar30._12_4_ = auVar221._12_4_ * auVar19._12_4_;
          auVar30._16_4_ = auVar221._16_4_ * auVar19._16_4_;
          auVar30._20_4_ = auVar221._20_4_ * auVar19._20_4_;
          auVar30._24_4_ = auVar221._24_4_ * auVar19._24_4_;
          auVar30._28_4_ = auVar19._28_4_;
          auVar19 = vminps_avx(auVar29,auVar30);
          auVar20 = vsubps_avx(auVar141,local_1600);
          auVar31._4_4_ = local_1420._4_4_ * auVar20._4_4_;
          auVar31._0_4_ = local_1420._0_4_ * auVar20._0_4_;
          auVar31._8_4_ = local_1420._8_4_ * auVar20._8_4_;
          auVar31._12_4_ = local_1420._12_4_ * auVar20._12_4_;
          auVar31._16_4_ = local_1420._16_4_ * auVar20._16_4_;
          auVar31._20_4_ = local_1420._20_4_ * auVar20._20_4_;
          auVar31._24_4_ = local_1420._24_4_ * auVar20._24_4_;
          auVar31._28_4_ = auVar20._28_4_;
          auVar20 = vminps_avx(auVar31,local_1460);
          auVar19 = vminps_avx(auVar19,auVar20);
          auVar18 = vcmpps_avx(auVar18,auVar19,2);
          auVar126 = vpcmpeqd_avx(auVar19._0_16_,auVar19._0_16_);
          auVar75 = vpmovsxbd_avx(auVar75 ^ auVar126);
          auVar74 = vpmovsxbd_avx(auVar74 ^ auVar126);
          auVar76._16_16_ = auVar74;
          auVar76._0_16_ = auVar75;
          auVar19 = vcvtdq2ps_avx(auVar76);
          auVar78._8_4_ = 0xbf800000;
          auVar78._0_8_ = 0xbf800000bf800000;
          auVar78._12_4_ = 0xbf800000;
          auVar78._16_4_ = 0xbf800000;
          auVar78._20_4_ = 0xbf800000;
          auVar78._24_4_ = 0xbf800000;
          auVar78._28_4_ = 0xbf800000;
          auVar19 = vcmpps_avx(auVar78,auVar19,1);
          auVar18 = vandps_avx(auVar18,auVar19);
          uVar63 = vmovmskps_avx(auVar18);
          if (uVar63 == 0) goto LAB_002f072b;
          lVar12 = 0;
          if ((byte)uVar63 != 0) {
            for (; ((byte)uVar63 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar69 = *(ulong *)(uVar61 + lVar12 * 8);
          uVar63 = (uVar63 & 0xff) - 1 & uVar63 & 0xff;
          if (uVar63 != 0) {
            *puVar67 = uVar69;
            puVar67 = puVar67 + 1;
            lVar12 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            uVar69 = *(ulong *)(uVar61 + lVar12 * 8);
            uVar63 = uVar63 - 1 & uVar63;
            uVar65 = (ulong)uVar63;
            if (uVar63 != 0) {
              do {
                *puVar67 = uVar69;
                puVar67 = puVar67 + 1;
                lVar12 = 0;
                if (uVar65 != 0) {
                  for (; (uVar65 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                uVar69 = *(ulong *)(uVar61 + lVar12 * 8);
                uVar65 = uVar65 & uVar65 - 1;
              } while (uVar65 != 0);
            }
          }
        }
        local_1770 = (ulong)((uint)uVar69 & 0xf) - 8;
        if (local_1770 != 0) {
          uVar69 = uVar69 & 0xfffffffffffffff0;
          pSVar5 = context->scene;
          local_1768 = 0;
          local_1778 = puVar67;
          local_1620 = auVar212._0_32_;
          local_1640 = auVar221._0_32_;
          do {
            lVar62 = local_1768 * 0x60;
            ppfVar6 = (pSVar5->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar69 + 0x40 + lVar62)];
            pfVar8 = ppfVar6[*(uint *)(uVar69 + 0x44 + lVar62)];
            pfVar9 = ppfVar6[*(uint *)(uVar69 + 0x48 + lVar62)];
            pfVar10 = ppfVar6[*(uint *)(uVar69 + 0x4c + lVar62)];
            auVar126 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar69 + lVar62)),
                                     *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar69 + 8 + lVar62))
                                    );
            auVar75 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar69 + lVar62)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar69 + 8 + lVar62)))
            ;
            auVar97 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar69 + 4 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar69 + 0xc + lVar62)));
            auVar74 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar69 + 4 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar69 + 0xc + lVar62)));
            auVar127 = vunpcklps_avx(auVar75,auVar74);
            auVar77 = vunpcklps_avx(auVar126,auVar97);
            auVar75 = vunpckhps_avx(auVar126,auVar97);
            auVar97 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar69 + 0x10 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar69 + 0x18 + lVar62)));
            auVar74 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar69 + 0x10 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar69 + 0x18 + lVar62)));
            auVar98 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar69 + 0x14 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar69 + 0x1c + lVar62)));
            auVar126 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar69 + 0x14 + lVar62)),
                                     *(undefined1 (*) [16])
                                      (pfVar10 + *(uint *)(uVar69 + 0x1c + lVar62)));
            auVar87 = vunpcklps_avx(auVar74,auVar126);
            auVar88 = vunpcklps_avx(auVar97,auVar98);
            auVar74 = vunpckhps_avx(auVar97,auVar98);
            auVar98 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar69 + 0x20 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar69 + 0x28 + lVar62)));
            auVar126 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar69 + 0x20 + lVar62)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar69 + 0x28 + lVar62)));
            auVar99 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar69 + 0x24 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar69 + 0x2c + lVar62)));
            auVar97 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar69 + 0x24 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar69 + 0x2c + lVar62)));
            auVar110 = vunpcklps_avx(auVar126,auVar97);
            auVar128 = vunpcklps_avx(auVar98,auVar99);
            auVar126 = vunpckhps_avx(auVar98,auVar99);
            auVar99 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar69 + 0x30 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar69 + 0x38 + lVar62)));
            auVar97 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar69 + 0x30 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar69 + 0x38 + lVar62)));
            auVar129 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar69 + 0x34 + lVar62)),
                                     *(undefined1 (*) [16])
                                      (pfVar10 + *(uint *)(uVar69 + 0x3c + lVar62)));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar69 + 0x34 + lVar62)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar69 + 0x3c + lVar62)));
            auVar98 = vunpcklps_avx(auVar97,auVar98);
            auVar140 = vunpcklps_avx(auVar99,auVar129);
            lVar12 = uVar69 + 0x40 + lVar62;
            local_13e0 = *(undefined8 *)(lVar12 + 0x10);
            uStack_13d8 = *(undefined8 *)(lVar12 + 0x18);
            auVar97 = vunpckhps_avx(auVar99,auVar129);
            uStack_13d0 = local_13e0;
            uStack_13c8 = uStack_13d8;
            lVar62 = uVar69 + 0x50 + lVar62;
            local_1400 = *(undefined8 *)(lVar62 + 0x10);
            uStack_13f8 = *(undefined8 *)(lVar62 + 0x18);
            uStack_13f0 = local_1400;
            uStack_13e8 = uStack_13f8;
            auVar132._16_16_ = auVar128;
            auVar132._0_16_ = auVar77;
            auVar154._16_16_ = auVar126;
            auVar154._0_16_ = auVar75;
            auVar79._16_16_ = auVar110;
            auVar79._0_16_ = auVar127;
            auVar113._16_16_ = auVar88;
            auVar113._0_16_ = auVar88;
            auVar211._16_16_ = auVar74;
            auVar211._0_16_ = auVar74;
            auVar91._16_16_ = auVar87;
            auVar91._0_16_ = auVar87;
            auVar179._16_16_ = auVar140;
            auVar179._0_16_ = auVar140;
            auVar162._16_16_ = auVar97;
            auVar162._0_16_ = auVar97;
            auVar189._16_16_ = auVar98;
            auVar189._0_16_ = auVar98;
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar191._4_4_ = uVar3;
            auVar191._0_4_ = uVar3;
            auVar191._8_4_ = uVar3;
            auVar191._12_4_ = uVar3;
            auVar191._16_4_ = uVar3;
            auVar191._20_4_ = uVar3;
            auVar191._24_4_ = uVar3;
            auVar191._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar200._4_4_ = uVar3;
            auVar200._0_4_ = uVar3;
            auVar200._8_4_ = uVar3;
            auVar200._12_4_ = uVar3;
            auVar200._16_4_ = uVar3;
            auVar200._20_4_ = uVar3;
            auVar200._24_4_ = uVar3;
            auVar200._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar208._4_4_ = uVar3;
            auVar208._0_4_ = uVar3;
            auVar208._8_4_ = uVar3;
            auVar208._12_4_ = uVar3;
            auVar208._16_4_ = uVar3;
            auVar208._20_4_ = uVar3;
            auVar208._24_4_ = uVar3;
            auVar208._28_4_ = uVar3;
            local_1660 = vsubps_avx(auVar132,auVar191);
            local_1680 = vsubps_avx(auVar154,auVar200);
            local_16a0 = vsubps_avx(auVar79,auVar208);
            auVar18 = vsubps_avx(auVar113,auVar191);
            auVar19 = vsubps_avx(auVar211,auVar200);
            auVar20 = vsubps_avx(auVar91,auVar208);
            auVar79 = vsubps_avx(auVar179,auVar191);
            auVar21 = vsubps_avx(auVar162,auVar200);
            auVar22 = vsubps_avx(auVar189,auVar208);
            local_16c0 = vsubps_avx(auVar79,local_1660);
            local_14a0 = vsubps_avx(auVar21,local_1680);
            local_14c0 = vsubps_avx(auVar22,local_16a0);
            fVar107 = local_1680._0_4_;
            fVar108 = auVar21._0_4_ + fVar107;
            fVar118 = local_1680._4_4_;
            fVar116 = auVar21._4_4_ + fVar118;
            fVar13 = local_1680._8_4_;
            fVar119 = auVar21._8_4_ + fVar13;
            fVar82 = local_1680._12_4_;
            fVar121 = auVar21._12_4_ + fVar82;
            fVar84 = local_1680._16_4_;
            fVar122 = auVar21._16_4_ + fVar84;
            fVar86 = local_1680._20_4_;
            fVar123 = auVar21._20_4_ + fVar86;
            fVar16 = local_1680._24_4_;
            fVar124 = auVar21._24_4_ + fVar16;
            fVar73 = local_1680._28_4_;
            fVar219 = local_16a0._0_4_;
            fVar125 = fVar219 + auVar22._0_4_;
            fVar222 = local_16a0._4_4_;
            fVar133 = fVar222 + auVar22._4_4_;
            fVar224 = local_16a0._8_4_;
            fVar134 = fVar224 + auVar22._8_4_;
            fVar226 = local_16a0._12_4_;
            fVar135 = fVar226 + auVar22._12_4_;
            fVar228 = local_16a0._16_4_;
            fVar136 = fVar228 + auVar22._16_4_;
            fVar230 = local_16a0._20_4_;
            fVar137 = fVar230 + auVar22._20_4_;
            fVar232 = local_16a0._24_4_;
            fVar138 = fVar232 + auVar22._24_4_;
            fVar94 = local_16a0._28_4_;
            fVar139 = local_14c0._0_4_;
            fVar145 = local_14c0._4_4_;
            auVar23._4_4_ = fVar145 * fVar116;
            auVar23._0_4_ = fVar139 * fVar108;
            fVar146 = local_14c0._8_4_;
            auVar23._8_4_ = fVar146 * fVar119;
            fVar147 = local_14c0._12_4_;
            auVar23._12_4_ = fVar147 * fVar121;
            fVar148 = local_14c0._16_4_;
            auVar23._16_4_ = fVar148 * fVar122;
            fVar149 = local_14c0._20_4_;
            auVar23._20_4_ = fVar149 * fVar123;
            fVar150 = local_14c0._24_4_;
            auVar23._24_4_ = fVar150 * fVar124;
            auVar23._28_4_ = auVar97._12_4_;
            fVar199 = local_14a0._0_4_;
            fVar202 = local_14a0._4_4_;
            auVar24._4_4_ = fVar202 * fVar133;
            auVar24._0_4_ = fVar199 * fVar125;
            fVar203 = local_14a0._8_4_;
            auVar24._8_4_ = fVar203 * fVar134;
            fVar204 = local_14a0._12_4_;
            auVar24._12_4_ = fVar204 * fVar135;
            fVar205 = local_14a0._16_4_;
            auVar24._16_4_ = fVar205 * fVar136;
            fVar206 = local_14a0._20_4_;
            auVar24._20_4_ = fVar206 * fVar137;
            fVar207 = local_14a0._24_4_;
            auVar24._24_4_ = fVar207 * fVar138;
            auVar24._28_4_ = auVar140._12_4_;
            auVar23 = vsubps_avx(auVar24,auVar23);
            fVar115 = local_1660._0_4_;
            fVar175 = auVar79._0_4_ + fVar115;
            fVar120 = local_1660._4_4_;
            fVar181 = auVar79._4_4_ + fVar120;
            fVar14 = local_1660._8_4_;
            fVar182 = auVar79._8_4_ + fVar14;
            fVar83 = local_1660._12_4_;
            fVar183 = auVar79._12_4_ + fVar83;
            fVar85 = local_1660._16_4_;
            fVar184 = auVar79._16_4_ + fVar85;
            fVar15 = local_1660._20_4_;
            fVar185 = auVar79._20_4_ + fVar15;
            fVar17 = local_1660._24_4_;
            fVar186 = auVar79._24_4_ + fVar17;
            fVar190 = local_16c0._0_4_;
            fVar193 = local_16c0._4_4_;
            auVar25._4_4_ = fVar193 * fVar133;
            auVar25._0_4_ = fVar190 * fVar125;
            fVar194 = local_16c0._8_4_;
            auVar25._8_4_ = fVar194 * fVar134;
            fVar195 = local_16c0._12_4_;
            auVar25._12_4_ = fVar195 * fVar135;
            fVar196 = local_16c0._16_4_;
            auVar25._16_4_ = fVar196 * fVar136;
            fVar197 = local_16c0._20_4_;
            auVar25._20_4_ = fVar197 * fVar137;
            fVar198 = local_16c0._24_4_;
            auVar25._24_4_ = fVar198 * fVar138;
            auVar25._28_4_ = fVar94 + auVar22._28_4_;
            auVar91 = local_14c0;
            auVar32._4_4_ = fVar181 * fVar145;
            auVar32._0_4_ = fVar175 * fVar139;
            auVar32._8_4_ = fVar182 * fVar146;
            auVar32._12_4_ = fVar183 * fVar147;
            auVar32._16_4_ = fVar184 * fVar148;
            auVar32._20_4_ = fVar185 * fVar149;
            auVar32._24_4_ = fVar186 * fVar150;
            auVar32._28_4_ = auVar98._12_4_;
            auVar24 = vsubps_avx(auVar32,auVar25);
            auVar33._4_4_ = fVar202 * fVar181;
            auVar33._0_4_ = fVar199 * fVar175;
            auVar33._8_4_ = fVar203 * fVar182;
            auVar33._12_4_ = fVar204 * fVar183;
            auVar33._16_4_ = fVar205 * fVar184;
            auVar33._20_4_ = fVar206 * fVar185;
            auVar33._24_4_ = fVar207 * fVar186;
            auVar33._28_4_ = auVar79._28_4_ + local_1660._28_4_;
            auVar34._4_4_ = fVar193 * fVar116;
            auVar34._0_4_ = fVar190 * fVar108;
            auVar34._8_4_ = fVar194 * fVar119;
            auVar34._12_4_ = fVar195 * fVar121;
            auVar34._16_4_ = fVar196 * fVar122;
            auVar34._20_4_ = fVar197 * fVar123;
            auVar34._24_4_ = fVar198 * fVar124;
            auVar34._28_4_ = auVar21._28_4_ + fVar73;
            auVar25 = vsubps_avx(auVar34,auVar33);
            local_1760._4_4_ = (ray->dir).field_0.m128[1];
            fVar108 = (ray->dir).field_0.m128[2];
            local_16e0._4_4_ = fVar108;
            local_16e0._0_4_ = fVar108;
            local_16e0._8_4_ = fVar108;
            local_16e0._12_4_ = fVar108;
            local_16e0._16_4_ = fVar108;
            local_16e0._20_4_ = fVar108;
            local_16e0._24_4_ = fVar108;
            local_16e0._28_4_ = fVar108;
            local_15a0 = (ray->dir).field_0.m128[0];
            fStack_159c = local_15a0;
            fStack_1598 = local_15a0;
            fStack_1594 = local_15a0;
            fStack_1590 = local_15a0;
            fStack_158c = local_15a0;
            fStack_1588 = local_15a0;
            fStack_1584 = local_15a0;
            local_1520._0_4_ =
                 local_15a0 * auVar23._0_4_ +
                 local_1760._4_4_ * auVar24._0_4_ + fVar108 * auVar25._0_4_;
            local_1520._4_4_ =
                 local_15a0 * auVar23._4_4_ +
                 local_1760._4_4_ * auVar24._4_4_ + fVar108 * auVar25._4_4_;
            local_1520._8_4_ =
                 local_15a0 * auVar23._8_4_ +
                 local_1760._4_4_ * auVar24._8_4_ + fVar108 * auVar25._8_4_;
            local_1520._12_4_ =
                 local_15a0 * auVar23._12_4_ +
                 local_1760._4_4_ * auVar24._12_4_ + fVar108 * auVar25._12_4_;
            local_1520._16_4_ =
                 local_15a0 * auVar23._16_4_ +
                 local_1760._4_4_ * auVar24._16_4_ + fVar108 * auVar25._16_4_;
            local_1520._20_4_ =
                 local_15a0 * auVar23._20_4_ +
                 local_1760._4_4_ * auVar24._20_4_ + fVar108 * auVar25._20_4_;
            local_1520._24_4_ =
                 local_15a0 * auVar23._24_4_ +
                 local_1760._4_4_ * auVar24._24_4_ + fVar108 * auVar25._24_4_;
            local_1520._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar25._28_4_;
            local_14e0 = vsubps_avx(local_1680,auVar19);
            auVar23 = vsubps_avx(local_16a0,auVar20);
            fVar119 = fVar107 + auVar19._0_4_;
            fVar121 = fVar118 + auVar19._4_4_;
            fVar122 = fVar13 + auVar19._8_4_;
            fVar123 = fVar82 + auVar19._12_4_;
            fVar124 = fVar84 + auVar19._16_4_;
            fVar125 = fVar86 + auVar19._20_4_;
            fVar133 = fVar16 + auVar19._24_4_;
            fVar116 = auVar19._28_4_;
            fVar134 = fVar219 + auVar20._0_4_;
            fVar135 = fVar222 + auVar20._4_4_;
            fVar136 = fVar224 + auVar20._8_4_;
            fVar137 = fVar226 + auVar20._12_4_;
            fVar138 = fVar228 + auVar20._16_4_;
            fVar175 = fVar230 + auVar20._20_4_;
            fVar181 = fVar232 + auVar20._24_4_;
            fVar210 = auVar23._0_4_;
            fVar213 = auVar23._4_4_;
            auVar35._4_4_ = fVar213 * fVar121;
            auVar35._0_4_ = fVar210 * fVar119;
            fVar214 = auVar23._8_4_;
            auVar35._8_4_ = fVar214 * fVar122;
            fVar215 = auVar23._12_4_;
            auVar35._12_4_ = fVar215 * fVar123;
            fVar216 = auVar23._16_4_;
            auVar35._16_4_ = fVar216 * fVar124;
            fVar217 = auVar23._20_4_;
            auVar35._20_4_ = fVar217 * fVar125;
            fVar218 = auVar23._24_4_;
            auVar35._24_4_ = fVar218 * fVar133;
            auVar35._28_4_ = fVar94;
            fVar156 = local_14e0._0_4_;
            fVar163 = local_14e0._4_4_;
            auVar36._4_4_ = fVar163 * fVar135;
            auVar36._0_4_ = fVar156 * fVar134;
            fVar165 = local_14e0._8_4_;
            auVar36._8_4_ = fVar165 * fVar136;
            fVar167 = local_14e0._12_4_;
            auVar36._12_4_ = fVar167 * fVar137;
            fVar169 = local_14e0._16_4_;
            auVar36._16_4_ = fVar169 * fVar138;
            fVar171 = local_14e0._20_4_;
            auVar36._20_4_ = fVar171 * fVar175;
            fVar173 = local_14e0._24_4_;
            auVar36._24_4_ = fVar173 * fVar181;
            auVar36._28_4_ = fVar73;
            auVar23 = vsubps_avx(auVar36,auVar35);
            auVar24 = vsubps_avx(local_1660,auVar18);
            fVar220 = auVar24._0_4_;
            fVar223 = auVar24._4_4_;
            auVar37._4_4_ = fVar223 * fVar135;
            auVar37._0_4_ = fVar220 * fVar134;
            fVar225 = auVar24._8_4_;
            auVar37._8_4_ = fVar225 * fVar136;
            fVar227 = auVar24._12_4_;
            auVar37._12_4_ = fVar227 * fVar137;
            fVar229 = auVar24._16_4_;
            auVar37._16_4_ = fVar229 * fVar138;
            fVar231 = auVar24._20_4_;
            auVar37._20_4_ = fVar231 * fVar175;
            fVar233 = auVar24._24_4_;
            auVar37._24_4_ = fVar233 * fVar181;
            auVar37._28_4_ = fVar94 + auVar20._28_4_;
            fVar134 = auVar18._0_4_ + fVar115;
            fVar135 = auVar18._4_4_ + fVar120;
            fVar136 = auVar18._8_4_ + fVar14;
            fVar137 = auVar18._12_4_ + fVar83;
            fVar138 = auVar18._16_4_ + fVar85;
            fVar175 = auVar18._20_4_ + fVar15;
            fVar181 = auVar18._24_4_ + fVar17;
            fVar95 = auVar18._28_4_;
            fVar187 = fVar95 + local_1660._28_4_;
            auVar38._4_4_ = fVar213 * fVar135;
            auVar38._0_4_ = fVar210 * fVar134;
            auVar38._8_4_ = fVar214 * fVar136;
            auVar38._12_4_ = fVar215 * fVar137;
            auVar38._16_4_ = fVar216 * fVar138;
            auVar38._20_4_ = fVar217 * fVar175;
            auVar38._24_4_ = fVar218 * fVar181;
            auVar38._28_4_ = fVar95;
            auVar24 = vsubps_avx(auVar38,auVar37);
            auVar39._4_4_ = fVar163 * fVar135;
            auVar39._0_4_ = fVar156 * fVar134;
            auVar39._8_4_ = fVar165 * fVar136;
            auVar39._12_4_ = fVar167 * fVar137;
            auVar39._16_4_ = fVar169 * fVar138;
            auVar39._20_4_ = fVar171 * fVar175;
            auVar39._24_4_ = fVar173 * fVar181;
            auVar39._28_4_ = fVar187;
            auVar40._4_4_ = fVar223 * fVar121;
            auVar40._0_4_ = fVar220 * fVar119;
            auVar40._8_4_ = fVar225 * fVar122;
            auVar40._12_4_ = fVar227 * fVar123;
            auVar40._16_4_ = fVar229 * fVar124;
            auVar40._20_4_ = fVar231 * fVar125;
            auVar40._24_4_ = fVar233 * fVar133;
            auVar40._28_4_ = fVar73 + fVar116;
            auVar25 = vsubps_avx(auVar40,auVar39);
            local_1540._0_4_ =
                 local_15a0 * auVar23._0_4_ +
                 local_1760._4_4_ * auVar24._0_4_ + fVar108 * auVar25._0_4_;
            local_1540._4_4_ =
                 local_15a0 * auVar23._4_4_ +
                 local_1760._4_4_ * auVar24._4_4_ + fVar108 * auVar25._4_4_;
            local_1540._8_4_ =
                 local_15a0 * auVar23._8_4_ +
                 local_1760._4_4_ * auVar24._8_4_ + fVar108 * auVar25._8_4_;
            local_1540._12_4_ =
                 local_15a0 * auVar23._12_4_ +
                 local_1760._4_4_ * auVar24._12_4_ + fVar108 * auVar25._12_4_;
            local_1540._16_4_ =
                 local_15a0 * auVar23._16_4_ +
                 local_1760._4_4_ * auVar24._16_4_ + fVar108 * auVar25._16_4_;
            local_1540._20_4_ =
                 local_15a0 * auVar23._20_4_ +
                 local_1760._4_4_ * auVar24._20_4_ + fVar108 * auVar25._20_4_;
            local_1540._24_4_ =
                 local_15a0 * auVar23._24_4_ +
                 local_1760._4_4_ * auVar24._24_4_ + fVar108 * auVar25._24_4_;
            local_1540._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar25._28_4_;
            local_1500 = vsubps_avx(auVar18,auVar79);
            fVar181 = auVar18._0_4_ + auVar79._0_4_;
            fVar182 = auVar18._4_4_ + auVar79._4_4_;
            fVar183 = auVar18._8_4_ + auVar79._8_4_;
            fVar184 = auVar18._12_4_ + auVar79._12_4_;
            fVar185 = auVar18._16_4_ + auVar79._16_4_;
            fVar186 = auVar18._20_4_ + auVar79._20_4_;
            fVar94 = auVar18._24_4_ + auVar79._24_4_;
            fVar95 = fVar95 + auVar79._28_4_;
            auVar79 = vsubps_avx(auVar19,auVar21);
            fVar133 = auVar19._0_4_ + auVar21._0_4_;
            fVar134 = auVar19._4_4_ + auVar21._4_4_;
            fVar135 = auVar19._8_4_ + auVar21._8_4_;
            fVar136 = auVar19._12_4_ + auVar21._12_4_;
            fVar137 = auVar19._16_4_ + auVar21._16_4_;
            fVar138 = auVar19._20_4_ + auVar21._20_4_;
            fVar175 = auVar19._24_4_ + auVar21._24_4_;
            auVar18 = vsubps_avx(auVar20,auVar22);
            fVar96 = auVar20._0_4_ + auVar22._0_4_;
            fVar101 = auVar20._4_4_ + auVar22._4_4_;
            fVar102 = auVar20._8_4_ + auVar22._8_4_;
            fVar103 = auVar20._12_4_ + auVar22._12_4_;
            fVar104 = auVar20._16_4_ + auVar22._16_4_;
            fVar105 = auVar20._20_4_ + auVar22._20_4_;
            fVar106 = auVar20._24_4_ + auVar22._24_4_;
            fVar73 = auVar18._0_4_;
            fVar119 = auVar18._4_4_;
            auVar19._4_4_ = fVar119 * fVar134;
            auVar19._0_4_ = fVar73 * fVar133;
            fVar121 = auVar18._8_4_;
            auVar19._8_4_ = fVar121 * fVar135;
            fVar122 = auVar18._12_4_;
            auVar19._12_4_ = fVar122 * fVar136;
            fVar123 = auVar18._16_4_;
            auVar19._16_4_ = fVar123 * fVar137;
            fVar124 = auVar18._20_4_;
            auVar19._20_4_ = fVar124 * fVar138;
            fVar125 = auVar18._24_4_;
            auVar19._24_4_ = fVar125 * fVar175;
            auVar19._28_4_ = fVar116;
            fVar157 = auVar79._0_4_;
            fVar164 = auVar79._4_4_;
            auVar18._4_4_ = fVar164 * fVar101;
            auVar18._0_4_ = fVar157 * fVar96;
            fVar166 = auVar79._8_4_;
            auVar18._8_4_ = fVar166 * fVar102;
            fVar168 = auVar79._12_4_;
            auVar18._12_4_ = fVar168 * fVar103;
            fVar170 = auVar79._16_4_;
            auVar18._16_4_ = fVar170 * fVar104;
            fVar172 = auVar79._20_4_;
            auVar18._20_4_ = fVar172 * fVar105;
            fVar174 = auVar79._24_4_;
            auVar18._24_4_ = fVar174 * fVar106;
            auVar18._28_4_ = fVar187;
            auVar18 = vsubps_avx(auVar18,auVar19);
            fVar109 = local_1500._0_4_;
            fVar117 = local_1500._4_4_;
            auVar41._4_4_ = fVar117 * fVar101;
            auVar41._0_4_ = fVar109 * fVar96;
            fVar96 = local_1500._8_4_;
            auVar41._8_4_ = fVar96 * fVar102;
            fVar101 = local_1500._12_4_;
            auVar41._12_4_ = fVar101 * fVar103;
            fVar102 = local_1500._16_4_;
            auVar41._16_4_ = fVar102 * fVar104;
            fVar103 = local_1500._20_4_;
            auVar41._20_4_ = fVar103 * fVar105;
            fVar104 = local_1500._24_4_;
            auVar41._24_4_ = fVar104 * fVar106;
            auVar41._28_4_ = auVar20._28_4_ + auVar22._28_4_;
            auVar20._4_4_ = fVar119 * fVar182;
            auVar20._0_4_ = fVar73 * fVar181;
            auVar20._8_4_ = fVar121 * fVar183;
            auVar20._12_4_ = fVar122 * fVar184;
            auVar20._16_4_ = fVar123 * fVar185;
            auVar20._20_4_ = fVar124 * fVar186;
            auVar20._24_4_ = fVar125 * fVar94;
            auVar20._28_4_ = fVar187;
            auVar19 = vsubps_avx(auVar20,auVar41);
            auVar22._4_4_ = fVar164 * fVar182;
            auVar22._0_4_ = fVar157 * fVar181;
            auVar22._8_4_ = fVar166 * fVar183;
            auVar22._12_4_ = fVar168 * fVar184;
            auVar22._16_4_ = fVar170 * fVar185;
            auVar22._20_4_ = fVar172 * fVar186;
            auVar22._24_4_ = fVar174 * fVar94;
            auVar22._28_4_ = fVar95;
            auVar23 = local_1500;
            auVar42._4_4_ = fVar117 * fVar134;
            auVar42._0_4_ = fVar109 * fVar133;
            auVar42._8_4_ = fVar96 * fVar135;
            auVar42._12_4_ = fVar101 * fVar136;
            auVar42._16_4_ = fVar102 * fVar137;
            auVar42._20_4_ = fVar103 * fVar138;
            auVar42._24_4_ = fVar104 * fVar175;
            auVar42._28_4_ = fVar116 + auVar21._28_4_;
            auVar20 = vsubps_avx(auVar42,auVar22);
            local_1760._0_4_ = local_1760._4_4_;
            fStack_1758 = local_1760._4_4_;
            fStack_1754 = local_1760._4_4_;
            fStack_1750 = local_1760._4_4_;
            fStack_174c = local_1760._4_4_;
            fStack_1748 = local_1760._4_4_;
            fStack_1744 = local_1760._4_4_;
            auVar80._0_4_ =
                 local_15a0 * auVar18._0_4_ +
                 local_1760._4_4_ * auVar19._0_4_ + fVar108 * auVar20._0_4_;
            auVar80._4_4_ =
                 local_15a0 * auVar18._4_4_ +
                 local_1760._4_4_ * auVar19._4_4_ + fVar108 * auVar20._4_4_;
            auVar80._8_4_ =
                 local_15a0 * auVar18._8_4_ +
                 local_1760._4_4_ * auVar19._8_4_ + fVar108 * auVar20._8_4_;
            auVar80._12_4_ =
                 local_15a0 * auVar18._12_4_ +
                 local_1760._4_4_ * auVar19._12_4_ + fVar108 * auVar20._12_4_;
            auVar80._16_4_ =
                 local_15a0 * auVar18._16_4_ +
                 local_1760._4_4_ * auVar19._16_4_ + fVar108 * auVar20._16_4_;
            auVar80._20_4_ =
                 local_15a0 * auVar18._20_4_ +
                 local_1760._4_4_ * auVar19._20_4_ + fVar108 * auVar20._20_4_;
            auVar80._24_4_ =
                 local_15a0 * auVar18._24_4_ +
                 local_1760._4_4_ * auVar19._24_4_ + fVar108 * auVar20._24_4_;
            auVar80._28_4_ = fVar95 + fVar95 + auVar20._28_4_;
            local_1560._0_4_ = auVar80._0_4_ + local_1520._0_4_ + local_1540._0_4_;
            local_1560._4_4_ = auVar80._4_4_ + local_1520._4_4_ + local_1540._4_4_;
            local_1560._8_4_ = auVar80._8_4_ + local_1520._8_4_ + local_1540._8_4_;
            local_1560._12_4_ = auVar80._12_4_ + local_1520._12_4_ + local_1540._12_4_;
            local_1560._16_4_ = auVar80._16_4_ + local_1520._16_4_ + local_1540._16_4_;
            local_1560._20_4_ = auVar80._20_4_ + local_1520._20_4_ + local_1540._20_4_;
            local_1560._24_4_ = auVar80._24_4_ + local_1520._24_4_ + local_1540._24_4_;
            local_1560._28_4_ = auVar80._28_4_ + local_1520._28_4_ + local_1540._28_4_;
            auVar18 = vminps_avx(local_1520,local_1540);
            auVar18 = vminps_avx(auVar18,auVar80);
            auVar114._8_4_ = 0x7fffffff;
            auVar114._0_8_ = 0x7fffffff7fffffff;
            auVar114._12_4_ = 0x7fffffff;
            auVar114._16_4_ = 0x7fffffff;
            auVar114._20_4_ = 0x7fffffff;
            auVar114._24_4_ = 0x7fffffff;
            auVar114._28_4_ = 0x7fffffff;
            local_1580 = vandps_avx(local_1560,auVar114);
            fVar116 = local_1580._0_4_ * 1.1920929e-07;
            fVar133 = local_1580._4_4_ * 1.1920929e-07;
            auVar21._4_4_ = fVar133;
            auVar21._0_4_ = fVar116;
            fVar134 = local_1580._8_4_ * 1.1920929e-07;
            auVar21._8_4_ = fVar134;
            fVar135 = local_1580._12_4_ * 1.1920929e-07;
            auVar21._12_4_ = fVar135;
            fVar136 = local_1580._16_4_ * 1.1920929e-07;
            auVar21._16_4_ = fVar136;
            fVar137 = local_1580._20_4_ * 1.1920929e-07;
            auVar21._20_4_ = fVar137;
            fVar138 = local_1580._24_4_ * 1.1920929e-07;
            auVar21._24_4_ = fVar138;
            auVar21._28_4_ = 0x34000000;
            auVar180._0_8_ = CONCAT44(fVar133,fVar116) ^ 0x8000000080000000;
            auVar180._8_4_ = -fVar134;
            auVar180._12_4_ = -fVar135;
            auVar180._16_4_ = -fVar136;
            auVar180._20_4_ = -fVar137;
            auVar180._24_4_ = -fVar138;
            auVar180._28_4_ = 0xb4000000;
            auVar18 = vcmpps_avx(auVar18,auVar180,5);
            auVar20 = vmaxps_avx(local_1520,local_1540);
            auVar19 = vmaxps_avx(auVar20,auVar80);
            auVar19 = vcmpps_avx(auVar19,auVar21,2);
            auVar19 = vorps_avx(auVar18,auVar19);
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = 0x3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar19 >> 0x7f,0) == '\0') &&
                  (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0xbf,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar19[0x1f]) {
LAB_002f06de:
              auVar192 = ZEXT3264(local_15c0);
              auVar201 = ZEXT3264(local_15e0);
              auVar209 = ZEXT3264(local_1600);
              auVar212 = ZEXT3264(local_1620);
              auVar221 = ZEXT3264(local_1640);
            }
            else {
              auVar43._4_4_ = fVar163 * fVar145;
              auVar43._0_4_ = fVar156 * fVar139;
              auVar43._8_4_ = fVar165 * fVar146;
              auVar43._12_4_ = fVar167 * fVar147;
              auVar43._16_4_ = fVar169 * fVar148;
              auVar43._20_4_ = fVar171 * fVar149;
              auVar43._24_4_ = fVar173 * fVar150;
              auVar43._28_4_ = auVar18._28_4_;
              auVar44._4_4_ = fVar202 * fVar213;
              auVar44._0_4_ = fVar199 * fVar210;
              auVar44._8_4_ = fVar203 * fVar214;
              auVar44._12_4_ = fVar204 * fVar215;
              auVar44._16_4_ = fVar205 * fVar216;
              auVar44._20_4_ = fVar206 * fVar217;
              auVar44._24_4_ = fVar207 * fVar218;
              auVar44._28_4_ = 0x34000000;
              auVar21 = vsubps_avx(auVar44,auVar43);
              auVar45._4_4_ = fVar213 * fVar164;
              auVar45._0_4_ = fVar210 * fVar157;
              auVar45._8_4_ = fVar214 * fVar166;
              auVar45._12_4_ = fVar215 * fVar168;
              auVar45._16_4_ = fVar216 * fVar170;
              auVar45._20_4_ = fVar217 * fVar172;
              auVar45._24_4_ = fVar218 * fVar174;
              auVar45._28_4_ = auVar20._28_4_;
              auVar46._4_4_ = fVar163 * fVar119;
              auVar46._0_4_ = fVar156 * fVar73;
              auVar46._8_4_ = fVar165 * fVar121;
              auVar46._12_4_ = fVar167 * fVar122;
              auVar46._16_4_ = fVar169 * fVar123;
              auVar46._20_4_ = fVar171 * fVar124;
              auVar46._24_4_ = fVar173 * fVar125;
              auVar46._28_4_ = local_1540._28_4_;
              auVar22 = vsubps_avx(auVar46,auVar45);
              auVar18 = vandps_avx(auVar43,auVar114);
              auVar20 = vandps_avx(auVar45,auVar114);
              auVar18 = vcmpps_avx(auVar18,auVar20,1);
              local_1360 = vblendvps_avx(auVar22,auVar21,auVar18);
              auVar47._4_4_ = fVar223 * fVar119;
              auVar47._0_4_ = fVar220 * fVar73;
              auVar47._8_4_ = fVar225 * fVar121;
              auVar47._12_4_ = fVar227 * fVar122;
              auVar47._16_4_ = fVar229 * fVar123;
              auVar47._20_4_ = fVar231 * fVar124;
              auVar47._24_4_ = fVar233 * fVar125;
              auVar47._28_4_ = auVar18._28_4_;
              auVar48._4_4_ = fVar223 * fVar145;
              auVar48._0_4_ = fVar220 * fVar139;
              auVar48._8_4_ = fVar225 * fVar146;
              auVar48._12_4_ = fVar227 * fVar147;
              auVar48._16_4_ = fVar229 * fVar148;
              auVar48._20_4_ = fVar231 * fVar149;
              auVar48._24_4_ = fVar233 * fVar150;
              auVar48._28_4_ = auVar21._28_4_;
              auVar49._4_4_ = fVar193 * fVar213;
              auVar49._0_4_ = fVar190 * fVar210;
              auVar49._8_4_ = fVar194 * fVar214;
              auVar49._12_4_ = fVar195 * fVar215;
              auVar49._16_4_ = fVar196 * fVar216;
              auVar49._20_4_ = fVar197 * fVar217;
              auVar49._24_4_ = fVar198 * fVar218;
              auVar49._28_4_ = local_14c0._28_4_;
              auVar21 = vsubps_avx(auVar48,auVar49);
              auVar50._4_4_ = fVar213 * fVar117;
              auVar50._0_4_ = fVar210 * fVar109;
              auVar50._8_4_ = fVar214 * fVar96;
              auVar50._12_4_ = fVar215 * fVar101;
              auVar50._16_4_ = fVar216 * fVar102;
              auVar50._20_4_ = fVar217 * fVar103;
              auVar50._24_4_ = fVar218 * fVar104;
              auVar50._28_4_ = auVar79._28_4_;
              auVar22 = vsubps_avx(auVar50,auVar47);
              auVar18 = vandps_avx(auVar49,auVar114);
              auVar20 = vandps_avx(auVar47,auVar114);
              auVar18 = vcmpps_avx(auVar18,auVar20,1);
              local_1340 = vblendvps_avx(auVar22,auVar21,auVar18);
              auVar51._4_4_ = fVar163 * fVar117;
              auVar51._0_4_ = fVar156 * fVar109;
              auVar51._8_4_ = fVar165 * fVar96;
              auVar51._12_4_ = fVar167 * fVar101;
              auVar51._16_4_ = fVar169 * fVar102;
              auVar51._20_4_ = fVar171 * fVar103;
              auVar51._24_4_ = fVar173 * fVar104;
              auVar51._28_4_ = auVar18._28_4_;
              auVar52._4_4_ = fVar193 * fVar163;
              auVar52._0_4_ = fVar190 * fVar156;
              auVar52._8_4_ = fVar194 * fVar165;
              auVar52._12_4_ = fVar195 * fVar167;
              auVar52._16_4_ = fVar196 * fVar169;
              auVar52._20_4_ = fVar197 * fVar171;
              auVar52._24_4_ = fVar198 * fVar173;
              auVar52._28_4_ = auVar21._28_4_;
              auVar53._4_4_ = fVar202 * fVar223;
              auVar53._0_4_ = fVar199 * fVar220;
              auVar53._8_4_ = fVar203 * fVar225;
              auVar53._12_4_ = fVar204 * fVar227;
              auVar53._16_4_ = fVar205 * fVar229;
              auVar53._20_4_ = fVar206 * fVar231;
              auVar53._24_4_ = fVar207 * fVar233;
              auVar53._28_4_ = local_1500._28_4_;
              auVar54._4_4_ = fVar223 * fVar164;
              auVar54._0_4_ = fVar220 * fVar157;
              auVar54._8_4_ = fVar225 * fVar166;
              auVar54._12_4_ = fVar227 * fVar168;
              auVar54._16_4_ = fVar229 * fVar170;
              auVar54._20_4_ = fVar231 * fVar172;
              auVar54._24_4_ = fVar233 * fVar174;
              auVar54._28_4_ = auVar79._28_4_;
              auVar79 = vsubps_avx(auVar52,auVar53);
              auVar21 = vsubps_avx(auVar54,auVar51);
              auVar18 = vandps_avx(auVar53,auVar114);
              auVar20 = vandps_avx(auVar51,auVar114);
              auVar18 = vcmpps_avx(auVar18,auVar20,1);
              local_1320 = vblendvps_avx(auVar21,auVar79,auVar18);
              auVar75 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
              fVar175 = local_1320._0_4_;
              fVar181 = local_1320._4_4_;
              fVar182 = local_1320._8_4_;
              fVar183 = local_1320._12_4_;
              fVar184 = local_1320._16_4_;
              fVar185 = local_1320._20_4_;
              fVar186 = local_1320._24_4_;
              fVar94 = local_1340._0_4_;
              fVar95 = local_1340._4_4_;
              fVar96 = local_1340._8_4_;
              fVar101 = local_1340._12_4_;
              fVar102 = local_1340._16_4_;
              fVar103 = local_1340._20_4_;
              fVar104 = local_1340._24_4_;
              fVar73 = local_1360._0_4_;
              fVar116 = local_1360._4_4_;
              fVar119 = local_1360._8_4_;
              fVar121 = local_1360._12_4_;
              fVar122 = local_1360._16_4_;
              fVar123 = local_1360._20_4_;
              fVar124 = local_1360._24_4_;
              fVar125 = local_15a0 * fVar73 + fVar94 * local_1760._4_4_ + fVar175 * fVar108;
              fVar133 = local_15a0 * fVar116 + fVar95 * local_1760._4_4_ + fVar181 * fVar108;
              fVar134 = local_15a0 * fVar119 + fVar96 * local_1760._4_4_ + fVar182 * fVar108;
              fVar135 = local_15a0 * fVar121 + fVar101 * local_1760._4_4_ + fVar183 * fVar108;
              fVar136 = local_15a0 * fVar122 + fVar102 * local_1760._4_4_ + fVar184 * fVar108;
              fVar137 = local_15a0 * fVar123 + fVar103 * local_1760._4_4_ + fVar185 * fVar108;
              fVar108 = local_15a0 * fVar124 + fVar104 * local_1760._4_4_ + fVar186 * fVar108;
              fVar138 = auVar18._28_4_ + auVar18._28_4_ + auVar19._28_4_;
              auVar92._0_4_ = fVar125 + fVar125;
              auVar92._4_4_ = fVar133 + fVar133;
              auVar92._8_4_ = fVar134 + fVar134;
              auVar92._12_4_ = fVar135 + fVar135;
              auVar92._16_4_ = fVar136 + fVar136;
              auVar92._20_4_ = fVar137 + fVar137;
              auVar92._24_4_ = fVar108 + fVar108;
              auVar92._28_4_ = fVar138 + fVar138;
              fVar125 = auVar79._28_4_;
              auVar18 = vrcpps_avx(auVar92);
              fVar133 = fVar73 * fVar115 + fVar94 * fVar107 + fVar175 * fVar219;
              fVar134 = fVar116 * fVar120 + fVar95 * fVar118 + fVar181 * fVar222;
              fVar135 = fVar119 * fVar14 + fVar96 * fVar13 + fVar182 * fVar224;
              fVar82 = fVar121 * fVar83 + fVar101 * fVar82 + fVar183 * fVar226;
              fVar83 = fVar122 * fVar85 + fVar102 * fVar84 + fVar184 * fVar228;
              fVar84 = fVar123 * fVar15 + fVar103 * fVar86 + fVar185 * fVar230;
              fVar85 = fVar124 * fVar17 + fVar104 * fVar16 + fVar186 * fVar232;
              fVar86 = fVar125 + fVar125 + fVar138;
              fVar86 = fVar86 + fVar86;
              fVar108 = auVar18._0_4_;
              fVar107 = auVar18._4_4_;
              auVar55._4_4_ = auVar92._4_4_ * fVar107;
              auVar55._0_4_ = auVar92._0_4_ * fVar108;
              fVar115 = auVar18._8_4_;
              auVar55._8_4_ = auVar92._8_4_ * fVar115;
              fVar118 = auVar18._12_4_;
              auVar55._12_4_ = auVar92._12_4_ * fVar118;
              fVar120 = auVar18._16_4_;
              auVar55._16_4_ = auVar92._16_4_ * fVar120;
              fVar13 = auVar18._20_4_;
              auVar55._20_4_ = auVar92._20_4_ * fVar13;
              fVar14 = auVar18._24_4_;
              auVar55._24_4_ = auVar92._24_4_ * fVar14;
              auVar55._28_4_ = fVar125;
              auVar18 = vsubps_avx(auVar155,auVar55);
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar142._4_4_ = uVar3;
              auVar142._0_4_ = uVar3;
              auVar142._8_4_ = uVar3;
              auVar142._12_4_ = uVar3;
              auVar142._16_4_ = uVar3;
              auVar142._20_4_ = uVar3;
              auVar142._24_4_ = uVar3;
              auVar142._28_4_ = uVar3;
              local_12a0._4_4_ = (fVar134 + fVar134) * (fVar107 + fVar107 * auVar18._4_4_);
              local_12a0._0_4_ = (fVar133 + fVar133) * (fVar108 + fVar108 * auVar18._0_4_);
              local_12a0._8_4_ = (fVar135 + fVar135) * (fVar115 + fVar115 * auVar18._8_4_);
              local_12a0._12_4_ = (fVar82 + fVar82) * (fVar118 + fVar118 * auVar18._12_4_);
              local_12a0._16_4_ = (fVar83 + fVar83) * (fVar120 + fVar120 * auVar18._16_4_);
              local_12a0._20_4_ = (fVar84 + fVar84) * (fVar13 + fVar13 * auVar18._20_4_);
              local_12a0._24_4_ = (fVar85 + fVar85) * (fVar14 + fVar14 * auVar18._24_4_);
              local_12a0._28_4_ = fVar86;
              auVar18 = vcmpps_avx(auVar142,local_12a0,2);
              fVar108 = ray->tfar;
              auVar143._4_4_ = fVar108;
              auVar143._0_4_ = fVar108;
              auVar143._8_4_ = fVar108;
              auVar143._12_4_ = fVar108;
              auVar143._16_4_ = fVar108;
              auVar143._20_4_ = fVar108;
              auVar143._24_4_ = fVar108;
              auVar143._28_4_ = fVar108;
              auVar19 = vcmpps_avx(local_12a0,auVar143,2);
              auVar18 = vandps_avx(auVar19,auVar18);
              auVar19 = vcmpps_avx(auVar92,_DAT_01faff00,4);
              auVar18 = vandps_avx(auVar18,auVar19);
              auVar74 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
              auVar75 = vpand_avx(auVar74,auVar75);
              auVar74 = vpmovsxwd_avx(auVar75);
              auVar126 = vpshufd_avx(auVar75,0xee);
              auVar126 = vpmovsxwd_avx(auVar126);
              local_1300._16_16_ = auVar126;
              local_1300._0_16_ = auVar74;
              if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1300 >> 0x7f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar126 >> 0x3f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar126[0xf]) goto LAB_002f06de;
              local_13c0 = local_1520._0_4_;
              fStack_13bc = local_1520._4_4_;
              fStack_13b8 = local_1520._8_4_;
              fStack_13b4 = local_1520._12_4_;
              fStack_13b0 = local_1520._16_4_;
              fStack_13ac = local_1520._20_4_;
              fStack_13a8 = local_1520._24_4_;
              fStack_13a4 = local_1520._28_4_;
              local_13a0 = local_1540._0_4_;
              fStack_139c = local_1540._4_4_;
              fStack_1398 = local_1540._8_4_;
              fStack_1394 = local_1540._12_4_;
              fStack_1390 = local_1540._16_4_;
              fStack_138c = local_1540._20_4_;
              fStack_1388 = local_1540._24_4_;
              fStack_1384 = local_1540._28_4_;
              local_1380 = local_1560;
              auVar18 = vrcpps_avx(local_1560);
              local_1220 = local_1480;
              fVar108 = auVar18._0_4_;
              fVar107 = auVar18._4_4_;
              auVar56._4_4_ = local_1560._4_4_ * fVar107;
              auVar56._0_4_ = local_1560._0_4_ * fVar108;
              fVar115 = auVar18._8_4_;
              auVar56._8_4_ = local_1560._8_4_ * fVar115;
              fVar118 = auVar18._12_4_;
              auVar56._12_4_ = local_1560._12_4_ * fVar118;
              fVar120 = auVar18._16_4_;
              auVar56._16_4_ = local_1560._16_4_ * fVar120;
              fVar13 = auVar18._20_4_;
              auVar56._20_4_ = local_1560._20_4_ * fVar13;
              fVar14 = auVar18._24_4_;
              auVar56._24_4_ = local_1560._24_4_ * fVar14;
              auVar56._28_4_ = fVar86;
              auVar19 = vsubps_avx(auVar155,auVar56);
              auVar81._0_4_ = fVar108 + fVar108 * auVar19._0_4_;
              auVar81._4_4_ = fVar107 + fVar107 * auVar19._4_4_;
              auVar81._8_4_ = fVar115 + fVar115 * auVar19._8_4_;
              auVar81._12_4_ = fVar118 + fVar118 * auVar19._12_4_;
              auVar81._16_4_ = fVar120 + fVar120 * auVar19._16_4_;
              auVar81._20_4_ = fVar13 + fVar13 * auVar19._20_4_;
              auVar81._24_4_ = fVar14 + fVar14 * auVar19._24_4_;
              auVar81._28_4_ = auVar18._28_4_ + auVar19._28_4_;
              auVar93._8_4_ = 0x219392ef;
              auVar93._0_8_ = 0x219392ef219392ef;
              auVar93._12_4_ = 0x219392ef;
              auVar93._16_4_ = 0x219392ef;
              auVar93._20_4_ = 0x219392ef;
              auVar93._24_4_ = 0x219392ef;
              auVar93._28_4_ = 0x219392ef;
              auVar19 = vcmpps_avx(local_1580,auVar93,5);
              auVar18 = vandps_avx(auVar19,auVar81);
              auVar57._4_4_ = local_1520._4_4_ * auVar18._4_4_;
              auVar57._0_4_ = local_1520._0_4_ * auVar18._0_4_;
              auVar57._8_4_ = local_1520._8_4_ * auVar18._8_4_;
              auVar57._12_4_ = local_1520._12_4_ * auVar18._12_4_;
              auVar57._16_4_ = local_1520._16_4_ * auVar18._16_4_;
              auVar57._20_4_ = local_1520._20_4_ * auVar18._20_4_;
              auVar57._24_4_ = local_1520._24_4_ * auVar18._24_4_;
              auVar57._28_4_ = auVar19._28_4_;
              auVar19 = vminps_avx(auVar57,auVar155);
              auVar58._4_4_ = local_1540._4_4_ * auVar18._4_4_;
              auVar58._0_4_ = local_1540._0_4_ * auVar18._0_4_;
              auVar58._8_4_ = local_1540._8_4_ * auVar18._8_4_;
              auVar58._12_4_ = local_1540._12_4_ * auVar18._12_4_;
              auVar58._16_4_ = local_1540._16_4_ * auVar18._16_4_;
              auVar58._20_4_ = local_1540._20_4_ * auVar18._20_4_;
              auVar58._24_4_ = local_1540._24_4_ * auVar18._24_4_;
              auVar58._28_4_ = auVar18._28_4_;
              auVar20 = vminps_avx(auVar58,auVar155);
              auVar79 = vsubps_avx(auVar155,auVar19);
              auVar21 = vsubps_avx(auVar155,auVar20);
              auVar144._8_4_ = 0xbf800000;
              auVar144._0_8_ = 0xbf800000bf800000;
              auVar144._12_4_ = 0xbf800000;
              auVar144._16_4_ = 0xbf800000;
              auVar144._20_4_ = 0xbf800000;
              auVar144._24_4_ = 0xbf800000;
              auVar144._28_4_ = 0xbf800000;
              auVar18 = vblendvps_avx(auVar155,auVar144,local_1480);
              local_12c0 = vblendvps_avx(auVar20,auVar79,local_1480);
              local_12e0 = vblendvps_avx(auVar19,auVar21,local_1480);
              fVar108 = auVar18._0_4_;
              fVar107 = auVar18._4_4_;
              local_1280._4_4_ = fVar116 * fVar107;
              local_1280._0_4_ = fVar73 * fVar108;
              fVar115 = auVar18._8_4_;
              local_1280._8_4_ = fVar119 * fVar115;
              fVar118 = auVar18._12_4_;
              local_1280._12_4_ = fVar121 * fVar118;
              fVar120 = auVar18._16_4_;
              local_1280._16_4_ = fVar122 * fVar120;
              fVar13 = auVar18._20_4_;
              local_1280._20_4_ = fVar123 * fVar13;
              fVar14 = auVar18._24_4_;
              local_1280._24_4_ = fVar124 * fVar14;
              local_1280._28_4_ = local_12c0._28_4_;
              local_1260._4_4_ = fVar95 * fVar107;
              local_1260._0_4_ = fVar94 * fVar108;
              local_1260._8_4_ = fVar96 * fVar115;
              local_1260._12_4_ = fVar101 * fVar118;
              local_1260._16_4_ = fVar102 * fVar120;
              local_1260._20_4_ = fVar103 * fVar13;
              local_1260._24_4_ = fVar104 * fVar14;
              local_1260._28_4_ = local_12e0._28_4_;
              local_1240._4_4_ = fVar107 * fVar181;
              local_1240._0_4_ = fVar108 * fVar175;
              local_1240._8_4_ = fVar115 * fVar182;
              local_1240._12_4_ = fVar118 * fVar183;
              local_1240._16_4_ = fVar120 * fVar184;
              local_1240._20_4_ = fVar13 * fVar185;
              local_1240._24_4_ = fVar14 * fVar186;
              local_1240._28_4_ = auVar79._28_4_;
              auVar75 = vpsllw_avx(auVar75,0xf);
              auVar75 = vpacksswb_avx(auVar75,auVar75);
              uVar61 = (ulong)(byte)(SUB161(auVar75 >> 7,0) & 1 |
                                     (SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar75 >> 0x3f,0) << 7);
              auVar192 = ZEXT3264(local_15c0);
              auVar201 = ZEXT3264(local_15e0);
              auVar209 = ZEXT3264(local_1600);
              auVar212 = ZEXT3264(local_1620);
              auVar221 = ZEXT3264(local_1640);
              local_1500 = auVar23;
              local_14c0 = auVar91;
              do {
                uVar65 = 0;
                if (uVar61 != 0) {
                  for (; (uVar61 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
                  }
                }
                local_1728 = *(uint *)((long)&local_13e0 + uVar65 * 4);
                pGVar11 = (pSVar5->geometries).items[local_1728].ptr;
                if ((pGVar11->mask & ray->mask) == 0) {
                  uVar61 = uVar61 ^ 1L << (uVar65 & 0x3f);
                }
                else {
                  local_1760 = uVar65;
                  pRVar66 = context->args;
                  if ((pRVar66->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002f073e;
                  local_1660._0_8_ = uVar61;
                  local_15a0 = (float)uVar68;
                  fStack_159c = (float)(uVar68 >> 0x20);
                  local_16e0._0_8_ = context;
                  local_1710.context = context->user;
                  local_1740 = *(undefined4 *)(local_1280 + uVar65 * 4);
                  local_173c = *(undefined4 *)(local_1260 + uVar65 * 4);
                  local_1738 = *(undefined4 *)(local_1240 + uVar65 * 4);
                  local_1734 = *(undefined4 *)(local_12e0 + uVar65 * 4);
                  local_1730 = *(undefined4 *)(local_12c0 + uVar65 * 4);
                  local_172c = *(undefined4 *)((long)&local_1400 + uVar65 * 4);
                  local_1724 = (local_1710.context)->instID[0];
                  local_1720 = (local_1710.context)->instPrimID[0];
                  local_1680._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_12a0 + uVar65 * 4);
                  local_177c = -1;
                  local_1710.valid = &local_177c;
                  local_1710.geometryUserPtr = pGVar11->userPtr;
                  local_1710.hit = (RTCHitN *)&local_1740;
                  local_1710.N = 1;
                  local_16a0._0_8_ = pGVar11;
                  local_1710.ray = (RTCRayN *)ray;
                  if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002f0612:
                    if ((pRVar66->filter == (RTCFilterFunctionN)0x0) ||
                       ((((pRVar66->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         ((*(byte *)(local_16a0._0_8_ + 0x3e) & 0x40) == 0)) ||
                        ((*pRVar66->filter)(&local_1710), *local_1710.valid != 0)))) {
LAB_002f073e:
                      ray->tfar = -INFINITY;
                      return;
                    }
                  }
                  else {
                    local_16c0._0_8_ = pRVar66;
                    (*pGVar11->occlusionFilterN)(&local_1710);
                    pRVar66 = (RTCIntersectArguments *)local_16c0._0_8_;
                    if (*local_1710.valid != 0) goto LAB_002f0612;
                  }
                  ray->tfar = (float)local_1680._0_4_;
                  uVar61 = local_1660._0_8_ ^ 1L << (local_1760 & 0x3f);
                  auVar192 = ZEXT3264(local_15c0);
                  auVar201 = ZEXT3264(local_15e0);
                  auVar209 = ZEXT3264(local_1600);
                  uVar68 = CONCAT44(fStack_159c,local_15a0);
                  auVar212 = ZEXT3264(local_1620);
                  auVar221 = ZEXT3264(local_1640);
                  context = (RayQueryContext *)local_16e0._0_8_;
                }
                puVar67 = local_1778;
              } while (uVar61 != 0);
            }
            local_1768 = local_1768 + 1;
          } while (local_1768 != local_1770);
        }
LAB_002f072b:
      } while (puVar67 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }